

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

void Saig_ManCbaFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  
LAB_00589f5e:
  pAVar4 = pObj;
  if (pAVar4->TravId != p->nTravIds) {
    pAVar4->TravId = p->nTravIds;
    if (((ulong)pAVar4 & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar7 = (uint)*(ulong *)&pAVar4->field_0x18;
    uVar5 = uVar7 & 7;
    if (uVar5 != 1) {
      if (uVar5 == 2) {
        Vec_IntPush(vReasons,(pAVar4->field_0).CioId);
        return;
      }
      if ((uVar7 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldCex.c"
                      ,0x111,
                      "void Saig_ManCbaFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pAVar1 = pAVar4->pFanin0;
      if ((*(ulong *)&pAVar4->field_0x18 & 8) == 0) goto code_r0x00589fb9;
      Saig_ManCbaFindReason_rec(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),vPrios,vReasons)
      ;
      goto LAB_0058a072;
    }
  }
  return;
code_r0x00589fb9:
  uVar7 = (uint)pAVar1 & 1;
  pAVar6 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
  uVar5 = *(uint *)&pAVar6->field_0x18 >> 3 & 1;
  pAVar8 = (Aig_Obj_t *)((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe);
  uVar9 = (*(uint *)&pAVar8->field_0x18 >> 3 ^ (uint)pAVar4->pFanin1) & 1;
  if ((uVar7 != uVar5) && (uVar9 != 0)) {
    __assert_fail("!fPhase0 || !fPhase1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldCex.c"
                  ,0x11b,
                  "void Saig_ManCbaFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (((uVar7 != uVar5) || (pObj = pAVar6, uVar9 == 0)) &&
     ((uVar7 == uVar5 || (pObj = pAVar8, uVar9 != 0)))) {
    iVar3 = -1;
    iVar2 = -1;
    if (pAVar1 != (Aig_Obj_t *)0x0) {
      iVar2 = pAVar6->Id;
    }
    iVar2 = Vec_IntEntry(vPrios,iVar2);
    if (pAVar4->pFanin1 != (Aig_Obj_t *)0x0) {
      iVar3 = *(int *)(((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe) + 0x24);
    }
    iVar3 = Vec_IntEntry(vPrios,iVar3);
    if (iVar3 < iVar2) {
LAB_0058a072:
      pObj = (Aig_Obj_t *)((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe);
    }
    else {
      pObj = (Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe);
    }
  }
  goto LAB_00589f5e;
}

Assistant:

void Saig_ManCbaFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_ManCbaFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_ManCbaFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}